

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::compute_adam_update
               (size_t begin,size_t end,tensor *s,tensor *m,tensor *v,float t,float learning_rate,
               float weight_decay,float momentum1,float momentum2,tensor *params,tensor *params_grad
               )

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ostream *poVar7;
  fatal_error *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ostringstream dlib_o_out;
  string local_1c8;
  undefined1 local_1a8 [376];
  long lVar6;
  
  uVar1 = s->m_size;
  if ((((uVar1 == m->m_size) && (uVar1 == v->m_size)) && (uVar1 == params->m_size)) &&
     (uVar1 == params_grad->m_size)) {
    if ((begin <= end) && (end <= uVar1)) {
      fVar9 = powf(momentum2,t);
      fVar9 = 1.0 - fVar9;
      if (fVar9 < 0.0) {
        fVar9 = sqrtf(fVar9);
      }
      else {
        fVar9 = SQRT(fVar9);
      }
      fVar10 = powf(momentum1,t);
      iVar2 = (*m->_vptr_tensor[3])(m);
      lVar6 = CONCAT44(extraout_var,iVar2);
      iVar2 = (*v->_vptr_tensor[3])(v);
      iVar3 = (*s->_vptr_tensor[4])(s);
      iVar4 = (*params->_vptr_tensor[2])(params);
      iVar5 = (*params_grad->_vptr_tensor[2])();
      if (begin < end) {
        do {
          fVar11 = *(float *)(CONCAT44(extraout_var_02,iVar4) + begin * 4) * weight_decay +
                   *(float *)(CONCAT44(extraout_var_03,iVar5) + begin * 4);
          *(float *)(lVar6 + begin * 4) =
               *(float *)(lVar6 + begin * 4) * momentum1 + (1.0 - momentum1) * fVar11;
          fVar12 = *(float *)(CONCAT44(extraout_var_00,iVar2) + begin * 4) * momentum2 +
                   (1.0 - momentum2) * fVar11 * fVar11;
          *(float *)(CONCAT44(extraout_var_00,iVar2) + begin * 4) = fVar12;
          fVar11 = *(float *)(lVar6 + begin * 4);
          if (fVar12 < 0.0) {
            fVar12 = sqrtf(fVar12);
          }
          else {
            fVar12 = SQRT(fVar12);
          }
          *(float *)(CONCAT44(extraout_var_01,iVar3) + begin * 4) =
               (fVar11 * ((-fVar9 * learning_rate) / (1.0 - fVar10))) / (fVar12 + 1e-08);
          begin = begin + 1;
        } while (end != begin);
      }
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
    poVar7 = (ostream *)std::ostream::operator<<(local_1a8,0x26f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "void dlib::cpu::compute_adam_update(size_t, size_t, tensor &, tensor &, tensor &, const float, const float, const float, const float, const float, const tensor &, const tensor &)"
               ,0xb2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"begin <= end && end <= params.size()",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
    *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
         *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    pfVar8 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar8,EBROKEN_ASSERT,&local_1c8);
    __cxa_throw(pfVar8,&fatal_error::typeinfo,error::~error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
  poVar7 = (ostream *)std::ostream::operator<<(local_1a8,0x26e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "void dlib::cpu::compute_adam_update(size_t, size_t, tensor &, tensor &, tensor &, const float, const float, const float, const float, const float, const tensor &, const tensor &)"
             ,0xb2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "s.size() == m.size() && s.size() == v.size() && s.size() == params.size() && s.size() == params_grad.size()"
             ,0x6b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
       *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  pfVar8 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar8,EBROKEN_ASSERT,&local_1c8);
  __cxa_throw(pfVar8,&fatal_error::typeinfo,error::~error);
}

Assistant:

void compute_adam_update (
            size_t begin,
            size_t end,
            tensor& s,
            tensor& m,
            tensor& v,
            const float t,
            const float learning_rate,
            const float weight_decay,
            const float momentum1,
            const float momentum2,
            const tensor& params,
            const tensor& params_grad
        )
        {
            DLIB_CASSERT(s.size() == m.size() &&
                         s.size() == v.size() &&
                         s.size() == params.size() &&
                         s.size() == params_grad.size());
            DLIB_CASSERT(begin <= end && end <= params.size());
            const float eps = 1e-8;
            const float alpha = learning_rate*std::sqrt(1-std::pow(momentum2,t))/(1-std::pow(momentum1, t));

            // The loop is equivalent to doing this:
            //   m = momentum1*m + (1-momentum1)    *   (weight_decay*params + params_grad);
            //   v = momentum2*v + (1-momentum2)*squared(weight_decay*params + params_grad);
            //   s = -alpha*m/(sqrt(v) + eps);
            auto pm = m.host();
            auto pv = v.host();
            auto ps = s.host_write_only();
            auto pparams = params.host();
            auto ppgrad = params_grad.host();
            for (size_t i = begin; i < end; ++i)
            {
                float g = weight_decay*pparams[i] + ppgrad[i];
                pm[i] = momentum1*pm[i] + (1-momentum1)*g;
                pv[i] = momentum2*pv[i] + (1-momentum2)*g*g;
                ps[i] = -alpha*pm[i]/(std::sqrt(pv[i]) + eps);
            }
        }